

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageLevel.cpp
# Opt level: O2

void __thiscall
Imf_3_2::FlatImageLevel::insertChannel
          (FlatImageLevel *this,string *name,PixelType type,int xSampling,int ySampling,bool pLinear
          )

{
  iterator iVar1;
  TypedFlatImageChannel<Imath_3_2::half> *this_00;
  mapped_type *ppFVar2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>_>_>
          ::find(&(this->_channels)._M_t,name);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->_channels)._M_t._M_impl.super__Rb_tree_header) {
    ImageLevel::throwChannelExists(&this->super_ImageLevel,name);
  }
  if (type == UINT) {
    this_00 = (TypedFlatImageChannel<Imath_3_2::half> *)operator_new(0x40);
    TypedFlatImageChannel<unsigned_int>::TypedFlatImageChannel
              ((TypedFlatImageChannel<unsigned_int> *)this_00,this,xSampling,ySampling,pLinear);
  }
  else if (type == FLOAT) {
    this_00 = (TypedFlatImageChannel<Imath_3_2::half> *)operator_new(0x40);
    TypedFlatImageChannel<float>::TypedFlatImageChannel
              ((TypedFlatImageChannel<float> *)this_00,this,xSampling,ySampling,pLinear);
  }
  else {
    if (type != HALF) {
      return;
    }
    this_00 = (TypedFlatImageChannel<Imath_3_2::half> *)operator_new(0x40);
    TypedFlatImageChannel<Imath_3_2::half>::TypedFlatImageChannel
              (this_00,this,xSampling,ySampling,pLinear);
  }
  ppFVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>_>_>
            ::operator[](&this->_channels,name);
  *ppFVar2 = &this_00->super_FlatImageChannel;
  return;
}

Assistant:

void
FlatImageLevel::insertChannel (
    const string& name,
    PixelType     type,
    int           xSampling,
    int           ySampling,
    bool          pLinear)
{
    if (_channels.find (name) != _channels.end ()) throwChannelExists (name);

    switch (type)
    {
        case HALF:
            _channels[name] =
                new FlatHalfChannel (*this, xSampling, ySampling, pLinear);
            break;

        case FLOAT:
            _channels[name] =
                new FlatFloatChannel (*this, xSampling, ySampling, pLinear);
            break;

        case UINT:
            _channels[name] =
                new FlatUIntChannel (*this, xSampling, ySampling, pLinear);
            break;

        default: assert (false);
    }
}